

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall Vault::TlsStrategy::~TlsStrategy(TlsStrategy *this)

{
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__TlsStrategy_001c5770;
  std::__cxx11::string::~string((string *)&this->key_);
  std::__cxx11::string::~string((string *)&this->cert_);
  return;
}

Assistant:

explicit TlsStrategy(Certificate cert, Certificate key)
      : cert_(std::move(cert)), key_(std::move(key)) {}